

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int choose_filters(archive_read *a)

{
  int iVar1;
  long lStack_48;
  int r;
  ssize_t avail;
  archive_read_filter *filter;
  archive_read_filter_bidder *best_bidder;
  archive_read_filter_bidder *bidder;
  int best_bid;
  int bid;
  int i;
  int number_bidders;
  archive_read *a_local;
  
  _i = a;
  do {
    bid = 0xe;
    bidder._0_4_ = 0;
    filter = (archive_read_filter *)0x0;
    best_bidder = _i->bidders;
    for (best_bid = 0; best_bid < bid; best_bid = best_bid + 1) {
      if ((best_bidder->bid !=
           (_func_int_archive_read_filter_bidder_ptr_archive_read_filter_ptr *)0x0) &&
         (bidder._4_4_ = (*best_bidder->bid)(best_bidder,_i->filter), (int)bidder < bidder._4_4_)) {
        filter = (archive_read_filter *)best_bidder;
        bidder._0_4_ = bidder._4_4_;
      }
      best_bidder = best_bidder + 1;
    }
    if (filter == (archive_read_filter *)0x0) {
      __archive_read_filter_ahead(_i->filter,1,&stack0xffffffffffffffb8);
      if (lStack_48 < 0) {
        __archive_read_close_filters(_i);
        __archive_read_free_filters(_i);
        return -0x1e;
      }
      (_i->archive).compression_name = _i->filter->name;
      (_i->archive).compression_code = _i->filter->code;
      return 0;
    }
    avail = (ssize_t)calloc(1,0xb0);
    if ((archive_read_filter *)avail == (archive_read_filter *)0x0) {
      return -0x1e;
    }
    ((archive_read_filter *)avail)->bidder = (archive_read_filter_bidder *)filter;
    ((archive_read_filter *)avail)->archive = _i;
    ((archive_read_filter *)avail)->upstream = _i->filter;
    _i->filter = (archive_read_filter *)avail;
    iVar1 = (*(code *)filter->archive)(_i->filter);
  } while (iVar1 == 0);
  __archive_read_close_filters(_i);
  __archive_read_free_filters(_i);
  return -0x1e;
}

Assistant:

static int
choose_filters(struct archive_read *a)
{
	int number_bidders, i, bid, best_bid;
	struct archive_read_filter_bidder *bidder, *best_bidder;
	struct archive_read_filter *filter;
	ssize_t avail;
	int r;

	for (;;) {
		number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

		best_bid = 0;
		best_bidder = NULL;

		bidder = a->bidders;
		for (i = 0; i < number_bidders; i++, bidder++) {
			if (bidder->bid != NULL) {
				bid = (bidder->bid)(bidder, a->filter);
				if (bid > best_bid) {
					best_bid = bid;
					best_bidder = bidder;
				}
			}
		}

		/* If no bidder, we're done. */
		if (best_bidder == NULL) {
			/* Verify the filter by asking it for some data. */
			__archive_read_filter_ahead(a->filter, 1, &avail);
			if (avail < 0) {
				__archive_read_close_filters(a);
				__archive_read_free_filters(a);
				return (ARCHIVE_FATAL);
			}
			a->archive.compression_name = a->filter->name;
			a->archive.compression_code = a->filter->code;
			return (ARCHIVE_OK);
		}

		filter
		    = (struct archive_read_filter *)calloc(1, sizeof(*filter));
		if (filter == NULL)
			return (ARCHIVE_FATAL);
		filter->bidder = best_bidder;
		filter->archive = a;
		filter->upstream = a->filter;
		a->filter = filter;
		r = (best_bidder->init)(a->filter);
		if (r != ARCHIVE_OK) {
			__archive_read_close_filters(a);
			__archive_read_free_filters(a);
			return (ARCHIVE_FATAL);
		}
	}
}